

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBBcollider.cpp
# Opt level: O3

void __thiscall
chrono::collision::CHOBBcollider::CollideRecurse
          (CHOBBcollider *this,ChMatrix33<double> *boR,Vector *boT,CHOBBTree *o1,int b1,
          CHOBBTree *o2,int b2,eCollMode flag)

{
  int *piVar1;
  double dVar2;
  double dVar3;
  uint b1_00;
  uint b2_00;
  pointer pCVar4;
  bool bVar5;
  long lVar6;
  CHOBB *b2_01;
  CHOBB *b1_01;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  pointer local_c8;
  pointer pCStack_c0;
  double local_b8;
  Vector local_a8;
  ChMatrix33<double> Rc;
  Vector local_48;
  
  piVar1 = &(this->super_ChNarrowPhaseCollider).num_bv_tests;
  *piVar1 = *piVar1 + 1;
  lVar6 = (long)b2;
  local_48.m_data[0] = boT->m_data[0];
  local_48.m_data[1] = boT->m_data[1];
  b1_01 = (o1->b).
          super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>.
          _M_impl.super__Vector_impl_data._M_start + b1;
  b2_01 = (o2->b).
          super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>.
          _M_impl.super__Vector_impl_data._M_start + lVar6;
  local_48.m_data[2] = boT->m_data[2];
  bVar5 = CHOBB::OBB_Overlap(boR,&local_48,b1_01,b2_01);
  if (!bVar5) {
    return;
  }
  b1_00 = b1_01->first_child;
  lVar7 = (long)(int)b1_00;
  b2_00 = b2_01->first_child;
  uVar8 = (ulong)b2_00;
  if ((int)(b2_00 & b1_00) < 0) {
    piVar1 = &(this->super_ChNarrowPhaseCollider).num_geo_tests;
    *piVar1 = *piVar1 + 1;
    ChGeometryCollider::ComputeCollisions
              ((o1->super_ChCollisionTree).geometries.
               super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)~b1_00],
               &(this->super_ChNarrowPhaseCollider).R1,&(this->super_ChNarrowPhaseCollider).T1,
               (o2->super_ChCollisionTree).geometries.
               super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)~b2_00],
               &(this->super_ChNarrowPhaseCollider).R2,&(this->super_ChNarrowPhaseCollider).T2,
               &this->super_ChNarrowPhaseCollider,&(this->super_ChNarrowPhaseCollider).R,
               &(this->super_ChNarrowPhaseCollider).T,flag == ChC_FIRST_CONTACT);
    return;
  }
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (b1_01->d).m_data[0];
  dVar2 = (b1_01->d).m_data[1];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (b1_01->d).m_data[2];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (b2_01->d).m_data[0];
  dVar3 = (b2_01->d).m_data[1];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = (b2_01->d).m_data[2];
  local_a8.m_data[2] = 0.0;
  local_a8.m_data[0] = 0.0;
  local_a8.m_data[1] = 0.0;
  if ((int)b2_00 < 0) {
LAB_0083454a:
    local_c8 = (o1->b).
               super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar7;
    pCStack_c0 = (pointer)boR;
    ChMatrix33<double>::operator=
              (&Rc,(MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                    *)&local_c8);
    pCVar4 = (o1->b).
             super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ChTransform<double>::TransformParentToLocal(boT,&pCVar4[lVar7].To,&pCVar4[lVar7].Rot);
    local_a8.m_data[0] = (double)local_c8;
    local_a8.m_data[1] = (double)pCStack_c0;
    local_a8.m_data[2] = local_b8;
    CollideRecurse(this,&Rc,&local_a8,o1,b1_00,o2,b2,flag);
    if ((flag == ChC_FIRST_CONTACT) && (0 < (this->super_ChNarrowPhaseCollider).num_collision_pairs)
       ) {
      return;
    }
    lVar7 = lVar7 + 1;
    local_c8 = (o1->b).
               super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar7;
    pCStack_c0 = (pointer)boR;
    ChMatrix33<double>::operator=
              (&Rc,(MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                    *)&local_c8);
    pCVar4 = (o1->b).
             super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ChTransform<double>::TransformParentToLocal(boT,&pCVar4[lVar7].To,&pCVar4[lVar7].Rot);
    b1 = (int)lVar7;
    local_a8.m_data[2] = local_b8;
  }
  else {
    if (-1 < (int)b1_00) {
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar3 * dVar3;
      auVar13 = vfmadd213sd_fma(auVar13,auVar13,auVar14);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = dVar2 * dVar2;
      auVar9 = vfmadd213sd_fma(auVar9,auVar9,auVar12);
      auVar11 = vfmadd213sd_fma(auVar11,auVar11,auVar13);
      auVar9 = vfmadd213sd_fma(auVar10,auVar10,auVar9);
      if (auVar11._0_8_ < auVar9._0_8_) goto LAB_0083454a;
    }
    pCStack_c0 = (o2->b).
                 super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8;
    local_c8 = (pointer)boR;
    ChMatrix33<double>::operator=
              (&Rc,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                    *)&local_c8);
    ChTransform<double>::TransformLocalToParent
              (&(o2->b).
                super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar8].To,boT,boR);
    local_a8.m_data[0] = (double)local_c8;
    local_a8.m_data[1] = (double)pCStack_c0;
    local_a8.m_data[2] = local_b8;
    CollideRecurse(this,&Rc,&local_a8,o1,b1,o2,b2_00,flag);
    if ((flag == ChC_FIRST_CONTACT) && (0 < (this->super_ChNarrowPhaseCollider).num_collision_pairs)
       ) {
      return;
    }
    lVar6 = uVar8 + 1;
    pCStack_c0 = (o2->b).
                 super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar6;
    local_c8 = (pointer)boR;
    ChMatrix33<double>::operator=
              (&Rc,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                    *)&local_c8);
    ChTransform<double>::TransformLocalToParent
              (&(o2->b).
                super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar6].To,boT,boR);
    local_a8.m_data[2] = local_b8;
  }
  local_a8.m_data[0] = (double)local_c8;
  local_a8.m_data[1] = (double)pCStack_c0;
  CollideRecurse(this,&Rc,&local_a8,o1,b1,o2,(int)lVar6,flag);
  return;
}

Assistant:

void CHOBBcollider::CollideRecurse(ChMatrix33<>& boR,
                                   Vector& boT,
                                   CHOBBTree* o1,
                                   int b1,
                                   CHOBBTree* o2,
                                   int b2,
                                   eCollMode flag) {
    this->num_bv_tests++;

    CHOBB* box1 = o1->child(b1);
    CHOBB* box2 = o2->child(b2);

    // first thing, see if we're overlapping
    if (!CHOBB::OBB_Overlap(boR, boT, box1, box2))
        return;

    // if we are, see if we test geometries next

    int l1 = box1->IsLeaf();
    int l2 = box2->IsLeaf();

    //
    // CASE TWO LEAVES
    //

    if (l1 && l2) {
        this->num_geo_tests++;

        // transform the points in b2 into space of b1, then compare

        geometry::ChGeometry* mgeo1 = o1->geometries[box1->GetGeometryIndex()];
        geometry::ChGeometry* mgeo2 = o2->geometries[box2->GetGeometryIndex()];

        bool just_intersect = false;
        if (flag == ChNarrowPhaseCollider::ChC_FIRST_CONTACT)
            just_intersect = true;

        ChGeometryCollider::ComputeCollisions(*mgeo1, &this->R1, &this->T1, *mgeo2, &this->R2, &this->T2, *this,
                                              &this->R, &this->T, just_intersect);
        return;
    }

    // we don't, so decide whose children to visit next

    double sz1 = box1->GetSize();
    double sz2 = box2->GetSize();

    ChMatrix33<> Rc;
    Vector Tc;

    if (l2 || (!l1 && (sz1 > sz2))) {
        int c1 = box1->GetFirstChildIndex();
        int c2 = box1->GetSecondChildIndex();

        Rc = o1->child(c1)->Rot.transpose() * boR;

        Tc = ChTransform<>::TransformParentToLocal(boT, o1->child(c1)->To, o1->child(c1)->Rot);

        CollideRecurse(Rc, Tc, o1, c1, o2, b2, flag);

        if ((flag == ChC_FIRST_CONTACT) && (this->GetNumPairs() > 0))
            return;

        Rc = o1->child(c2)->Rot.transpose() * boR;

        Tc = ChTransform<>::TransformParentToLocal(boT, o1->child(c2)->To, o1->child(c2)->Rot);

        CollideRecurse(Rc, Tc, o1, c2, o2, b2, flag);
    } else {
        int c1 = box2->GetFirstChildIndex();
        int c2 = box2->GetSecondChildIndex();

        Rc = boR * o2->child(c1)->Rot;

        Tc = ChTransform<>::TransformLocalToParent(o2->child(c1)->To, boT, boR);

        CollideRecurse(Rc, Tc, o1, b1, o2, c1, flag);

        if ((flag == ChC_FIRST_CONTACT) && (this->GetNumPairs() > 0))
            return;

        Rc = boR * o2->child(c2)->Rot;

        Tc = ChTransform<>::TransformLocalToParent(o2->child(c2)->To, boT, boR);

        CollideRecurse(Rc, Tc, o1, b1, o2, c2, flag);
    }
}